

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_SetNativeIntElementI_Int32
               (Var instance,int aElementIndex,int32 iValue,ScriptContext *scriptContext,
               PropertyOperationFlags flags)

{
  bool bVar1;
  BOOL BVar2;
  PropertyOperationFlags flags_local;
  ScriptContext *scriptContext_local;
  int32 iValue_local;
  int aElementIndex_local;
  Var instance_local;
  undefined8 local_10;
  
  bVar1 = TaggedInt::IsOverflow(aElementIndex);
  if (bVar1) {
    local_10 = JavascriptNumber::NewInlined((double)aElementIndex,scriptContext);
  }
  else {
    local_10 = TaggedInt::ToVarUnchecked(aElementIndex);
  }
  BVar2 = OP_SetNativeIntElementI(instance,local_10,iValue,scriptContext,flags);
  return BVar2;
}

Assistant:

BOOL JavascriptOperators::OP_SetNativeIntElementI_Int32(
        Var instance,
        int aElementIndex,
        int32 iValue,
        ScriptContext* scriptContext,
        PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_SetNativeIntElementI_Int32);
        JIT_HELPER_SAME_ATTRIBUTES(Op_SetNativeIntElementI_Int32, Op_SetNativeIntElementI);
#if FLOATVAR
        return OP_SetNativeIntElementI(instance, Js::JavascriptNumber::ToVar(aElementIndex, scriptContext), iValue, scriptContext, flags);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_SetNativeIntElementI(instance, Js::JavascriptNumber::ToVarInPlace(aElementIndex, scriptContext,
            (Js::JavascriptNumber *)buffer), iValue, scriptContext, flags);
#endif
        JIT_HELPER_END(Op_SetNativeIntElementI_Int32);
    }